

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

HSQUIRRELVM sq_open(SQInteger initialstacksize)

{
  bool bVar1;
  SQSharedState *this;
  SQVM *this_00;
  
  this = (SQSharedState *)sq_vm_malloc(0x180);
  SQSharedState::SQSharedState(this);
  SQSharedState::Init(this);
  this_00 = (SQVM *)sq_vm_malloc(0x158);
  SQVM::SQVM(this_00,this);
  SQObjectPtr::operator=(&this->_root_vm,this_00);
  bVar1 = SQVM::Init(this_00,(SQVM *)0x0,initialstacksize);
  if (!bVar1) {
    (**(this_00->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)(this_00);
    sq_vm_free(this_00,0x158);
    this_00 = (SQVM *)0x0;
  }
  return this_00;
}

Assistant:

HSQUIRRELVM sq_open(SQInteger initialstacksize)
{
    SQSharedState *ss;
    SQVM *v;
    sq_new(ss, SQSharedState);
    ss->Init();
    v = (SQVM *)SQ_MALLOC(sizeof(SQVM));
    new (v) SQVM(ss);
    ss->_root_vm = v;
    if(v->Init(NULL, initialstacksize)) {
        return v;
    } else {
        sq_delete(v, SQVM);
        return NULL;
    }
    return v;
}